

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-val-req.cpp
# Opt level: O3

void __thiscall
yactfr::internal::JsonArrayValReq::JsonArrayValReq
          (JsonArrayValReq *this,optional<unsigned_long_long> *minSize,
          optional<unsigned_long_long> *maxSize,Sp *elemValReq)

{
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  unsigned_long_long uVar3;
  
  (this->super_JsonValReq)._kind.super_type = (type)0x600000001;
  (this->super_JsonValReq)._allowNull = false;
  (this->super_JsonValReq)._vptr_JsonValReq = (_func_int **)&PTR__JsonArrayValReq_002fce58;
  uVar3 = 0;
  if ((minSize->super_type).m_initialized != false) {
    uVar3 = (minSize->super_type).m_storage;
  }
  this->_minSize = uVar3;
  uVar3 = 0xffffffffffffffff;
  if ((maxSize->super_type).m_initialized != false) {
    uVar3 = (maxSize->super_type).m_storage;
  }
  this->_maxSize = uVar3;
  (this->_elemValReq).
  super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  peVar1 = (elemValReq->
           super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  p_Var2 = (elemValReq->
           super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>).
           _M_refcount._M_pi;
  (elemValReq->super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>).
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->_elemValReq).
  super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar1
  ;
  (this->_elemValReq).
  super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = p_Var2;
  (elemValReq->super___shared_ptr<const_yactfr::internal::JsonValReq,_(__gnu_cxx::_Lock_policy)2>).
  _M_ptr = (element_type *)0x0;
  return;
}

Assistant:

JsonArrayValReq::JsonArrayValReq(const boost::optional<Size>& minSize,
                                 const boost::optional<Size>& maxSize,
                                 JsonValReq::Sp elemValReq) :
    JsonValReq {JsonVal::Kind::Array},
    _minSize {minSize ? *minSize : std::numeric_limits<Size>::min()},
    _maxSize {maxSize ? *maxSize : std::numeric_limits<Size>::max()},
    _elemValReq {std::move(elemValReq)}
{
}